

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mecab.cpp
# Opt level: O0

int Mecab_load(Mecab *m,char *dicdir)

{
  int iVar1;
  size_t sVar2;
  undefined8 *__ptr;
  char *pcVar3;
  Model *pMVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  char *in_RSI;
  long in_RDI;
  Lattice *lattice;
  Tagger *tagger;
  Model *model;
  char **argv;
  int argc;
  int i;
  Mecab *in_stack_ffffffffffffffd0;
  int local_1c;
  long *plVar5;
  
  if (((in_RDI == 0) || (in_RSI == (char *)0x0)) || (sVar2 = strlen(in_RSI), sVar2 == 0)) {
    return 0;
  }
  Mecab_clear(in_stack_ffffffffffffffd0);
  __ptr = (undefined8 *)malloc(0x18);
  pcVar3 = strdup("mecab");
  *__ptr = pcVar3;
  pcVar3 = strdup("-d");
  __ptr[1] = pcVar3;
  pcVar3 = strdup(in_RSI);
  __ptr[2] = pcVar3;
  pMVar4 = MeCab::createModel((int)((ulong)__ptr >> 0x20),(char **)in_stack_ffffffffffffffd0);
  for (local_1c = 0; local_1c < 3; local_1c = local_1c + 1) {
    free((void *)__ptr[local_1c]);
  }
  free(__ptr);
  if (pMVar4 != (Model *)0x0) {
    iVar1 = (*pMVar4->_vptr_Model[3])();
    plVar5 = (long *)CONCAT44(extraout_var,iVar1);
    if (plVar5 == (long *)0x0) {
      if (pMVar4 != (Model *)0x0) {
        (*pMVar4->_vptr_Model[7])();
      }
      fprintf(_stderr,"ERROR: Mecab_load() in mecab.cpp: Cannot open %s.\n",in_RSI);
      return 0;
    }
    iVar1 = (*pMVar4->_vptr_Model[4])();
    if (CONCAT44(extraout_var_00,iVar1) != 0) {
      *(Model **)(in_RDI + 0x10) = pMVar4;
      *(long **)(in_RDI + 0x18) = plVar5;
      *(long *)(in_RDI + 0x20) = CONCAT44(extraout_var_00,iVar1);
      return 1;
    }
    if (pMVar4 != (Model *)0x0) {
      (*pMVar4->_vptr_Model[7])();
    }
    if (plVar5 != (long *)0x0) {
      (**(code **)(*plVar5 + 0xe8))();
    }
    fprintf(_stderr,"ERROR: Mecab_load() in mecab.cpp: Cannot open %s.\n",in_RSI);
    return 0;
  }
  fprintf(_stderr,"ERROR: Mecab_load() in mecab.cpp: Cannot open %s.\n",in_RSI);
  return 0;
}

Assistant:

BOOL Mecab_load(Mecab *m, const char *dicdir)
{
   int i;
   int argc = 3;
   char **argv;

   if(m == NULL)
      return FALSE;

   if(dicdir == NULL || strlen(dicdir) == 0)
      return FALSE;

   Mecab_clear(m);

   argv = (char **) malloc(sizeof(char *) * argc);

   argv[0] = strdup("mecab");
   argv[1] = strdup("-d");
   argv[2] = strdup(dicdir);

   MeCab::Model *model = MeCab::createModel(argc, argv);

   for(i = 0; i < argc; i++)
      free(argv[i]);
   free(argv);

   if(model == NULL) {
      fprintf(stderr, "ERROR: Mecab_load() in mecab.cpp: Cannot open %s.\n", dicdir);
      return FALSE;
   }

   MeCab::Tagger *tagger = model->createTagger();
   if(tagger == NULL) {
      delete model;
      fprintf(stderr, "ERROR: Mecab_load() in mecab.cpp: Cannot open %s.\n", dicdir);
      return FALSE;
   }

   MeCab::Lattice *lattice = model->createLattice();
   if(lattice == NULL) {
      delete model;
      delete tagger;
      fprintf(stderr, "ERROR: Mecab_load() in mecab.cpp: Cannot open %s.\n", dicdir);
      return FALSE;
   }

   m->model = (void *) model;
   m->tagger = (void *) tagger;
   m->lattice = (void *) lattice;

   return TRUE;
}